

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O0

void msd_D<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_long>
               (uchar **strings,size_t n,size_t depth,
               vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *buckets)

{
  size_type sVar1;
  reference pvVar2;
  uint local_87c;
  uint local_878;
  uint i_4;
  uint i_3;
  uint i_2;
  size_t pos;
  undefined1 local_860 [4];
  uint i_1;
  array<unsigned_long,_256UL> bucketsize;
  uint j_1;
  uint j;
  uchar cache [32];
  ulong local_30;
  size_t i;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *buckets_local;
  size_t depth_local;
  size_t n_local;
  uchar **strings_local;
  
  if (n < 0x20) {
    insertion_sort(strings,(int)n,depth);
  }
  else {
    for (local_30 = 0; local_30 < n - (n & 0x1f); local_30 = local_30 + 0x20) {
      for (bucketsize._M_elems[0xff]._4_4_ = 0; bucketsize._M_elems[0xff]._4_4_ < 0x20;
          bucketsize._M_elems[0xff]._4_4_ = bucketsize._M_elems[0xff]._4_4_ + 1) {
        *(uchar *)((long)&j_1 + (ulong)bucketsize._M_elems[0xff]._4_4_) =
             strings[local_30 + bucketsize._M_elems[0xff]._4_4_][depth];
      }
      for (bucketsize._M_elems[0xff]._0_4_ = 0; (uint)bucketsize._M_elems[0xff] < 0x20;
          bucketsize._M_elems[0xff]._0_4_ = (uint)bucketsize._M_elems[0xff] + 1) {
        std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
                  (buckets + *(byte *)((long)&j_1 + (ulong)(uint)bucketsize._M_elems[0xff]),
                   strings + local_30 + (uint)bucketsize._M_elems[0xff]);
      }
    }
    for (; local_30 < n; local_30 = local_30 + 1) {
      std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
                (buckets + strings[local_30][depth],strings + local_30);
    }
    for (pos._4_4_ = 0; pos._4_4_ < 0x100; pos._4_4_ = pos._4_4_ + 1) {
      sVar1 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size
                        (buckets + pos._4_4_);
      pvVar2 = std::array<unsigned_long,_256UL>::operator[]
                         ((array<unsigned_long,_256UL> *)local_860,(ulong)pos._4_4_);
      *pvVar2 = sVar1;
    }
    _i_3 = 0;
    for (i_4 = 0; i_4 < 0x100; i_4 = i_4 + 1) {
      pvVar2 = std::array<unsigned_long,_256UL>::operator[]
                         ((array<unsigned_long,_256UL> *)local_860,(ulong)i_4);
      if (*pvVar2 != 0) {
        copy<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char**>
                  (buckets + i_4,strings + _i_3);
        pvVar2 = std::array<unsigned_long,_256UL>::operator[]
                           ((array<unsigned_long,_256UL> *)local_860,(ulong)i_4);
        _i_3 = *pvVar2 + _i_3;
      }
    }
    for (local_878 = 0; local_878 < 0x100; local_878 = local_878 + 1) {
      std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::clear(buckets + local_878);
    }
    pvVar2 = std::array<unsigned_long,_256UL>::operator[]
                       ((array<unsigned_long,_256UL> *)local_860,0);
    _i_3 = *pvVar2;
    for (local_87c = 1; local_87c < 0x100; local_87c = local_87c + 1) {
      pvVar2 = std::array<unsigned_long,_256UL>::operator[]
                         ((array<unsigned_long,_256UL> *)local_860,(ulong)local_87c);
      if (*pvVar2 != 0) {
        pvVar2 = std::array<unsigned_long,_256UL>::operator[]
                           ((array<unsigned_long,_256UL> *)local_860,(ulong)local_87c);
        msd_D<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_long>
                  (strings + _i_3,*pvVar2,depth + 1,buckets);
        pvVar2 = std::array<unsigned_long,_256UL>::operator[]
                           ((array<unsigned_long,_256UL> *)local_860,(ulong)local_87c);
        _i_3 = *pvVar2 + _i_3;
      }
    }
  }
  return;
}

Assistant:

static void
msd_D(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		unsigned char cache[32];
		for (unsigned j=0; j < 32; ++j) {
			cache[j] = strings[i+j][depth];
		}
		for (unsigned j=0; j < 32; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		buckets[strings[i][depth]].push_back(strings[i]);
	}
	std::array<BucketsizeType, 256> bucketsize;
	for (unsigned i=0; i < 256; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 256; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_D<Bucket, BucketsizeType>(strings+pos, bucketsize[i], depth+1, buckets);
		pos += bucketsize[i];
	}
}